

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetProcAddressCoreFunctionsCase::executeTest(GetProcAddressCoreFunctionsCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  uint uVar2;
  TestLog *pTVar3;
  bool bVar4;
  uint uVar5;
  deUint32 err;
  Library *egl;
  __eglMustCastToProperFunctionPointerType p_Var6;
  long lVar7;
  qpTestResult testResult;
  char *pcVar8;
  TestContext *this_01;
  undefined **local_1d0;
  long local_1c8;
  ConfigAttribValueFmt local_1b8;
  MessageBuilder local_1b0;
  
  pTVar3 = ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"EGL_KHR_get_all_proc_addresses",(allocator<char> *)&local_1b8);
  bVar4 = GetProcAddressCase::isSupported(&this->super_GetProcAddressCase,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  egl = EglTestContext::getLibrary((this->super_GetProcAddressCase).super_TestCase.m_eglTestCtx);
  uVar5 = eglu::getRenderableAPIsMask(egl,(this->super_GetProcAddressCase).m_display);
  uVar2 = this->m_apiBit;
  if (uVar2 == 0) {
    local_1c8 = 0x22;
    local_1d0 = (undefined **)(anonymous_namespace)::s_EGL14;
  }
  else if (uVar2 == 0x40) {
    local_1c8 = 0x68;
    local_1d0 = (undefined **)(anonymous_namespace)::s_GLES30;
  }
  else if (uVar2 == 4) {
    local_1c8 = 0x8e;
    local_1d0 = (undefined **)(anonymous_namespace)::s_GLES20;
  }
  else if (uVar2 == 1) {
    local_1c8 = 0x90;
    local_1d0 = &(anonymous_namespace)::s_GLES10;
  }
  else {
    local_1d0 = (undefined **)0x0;
    local_1c8 = 0;
  }
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"EGL_KHR_get_all_proc_addresses: ");
  pcVar8 = "not supported";
  if (bVar4) {
    pcVar8 = "supported";
  }
  std::operator<<((ostream *)poVar1,pcVar8);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar5 = uVar5 & uVar2;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  if (uVar5 != uVar2) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    local_1b8 = (ConfigAttribValueFmt)((ulong)(uint)this->m_apiBit << 0x20 | 0x3040);
    eglu::operator<<((ostream *)poVar1,&local_1b8);
    std::operator<<((ostream *)poVar1," not supported by any available configuration.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    local_1b0.m_log = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  }
  this_00 = &(this->super_GetProcAddressCase).super_CallLogWrapper;
  poVar1 = &local_1b0.m_str;
  lVar7 = 0;
  do {
    if (local_1c8 == lVar7) {
      return;
    }
    pcVar8 = local_1d0[lVar7];
    p_Var6 = eglu::CallLogWrapper::eglGetProcAddress(this_00,pcVar8);
    err = eglu::CallLogWrapper::eglGetError(this_00);
    eglu::checkError(err,"eglGetProcAddress()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                     ,0xff);
    if (p_Var6 == (__eglMustCastToProperFunctionPointerType)0x0 && (bVar4 && uVar5 == uVar2)) {
      local_1b0.m_log = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Fail, received null pointer for supported function: ");
      std::operator<<((ostream *)poVar1,pcVar8);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      this_01 = (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      testResult = QP_TEST_RESULT_FAIL;
      pcVar8 = "Unexpected null pointer";
LAB_00238e1d:
      tcu::TestContext::setTestResult(this_01,testResult,pcVar8);
    }
    else if ((uVar5 != uVar2) && (p_Var6 != (__eglMustCastToProperFunctionPointerType)0x0)) {
      local_1b0.m_log = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,
                      "Warning, received non-null value for unsupported function: ");
      std::operator<<((ostream *)&local_1b0.m_str,pcVar8);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      this_01 = (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      testResult = QP_TEST_RESULT_QUALITY_WARNING;
      pcVar8 = "Non-null value for unsupported function";
      goto LAB_00238e1d;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void executeTest (void)
	{
		TestLog&				log					= m_testCtx.getLog();
		const bool				funcPtrSupported	= isSupported("EGL_KHR_get_all_proc_addresses");
		const bool				apiSupported		= (eglu::getRenderableAPIsMask(m_eglTestCtx.getLibrary(), m_display) & m_apiBit) == m_apiBit;
		const FunctionNames		funcNames			= getCoreFunctionNames(m_apiBit);

		log << TestLog::Message << "EGL_KHR_get_all_proc_addresses: " << (funcPtrSupported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (!apiSupported)
		{
			log << TestLog::Message << eglu::getConfigAttribValueStr(EGL_RENDERABLE_TYPE, m_apiBit) << " not supported by any available configuration." << TestLog::EndMessage;
			log << TestLog::Message << TestLog::EndMessage;
		}

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName			= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (apiSupported && funcPtrSupported && (funcPtr == 0))
			{
				log << TestLog::Message << "Fail, received null pointer for supported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
			else if (!apiSupported && (funcPtr != 0))
			{
				log << TestLog::Message << "Warning, received non-null value for unsupported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Non-null value for unsupported function");
			}
		}
	}